

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsKBI19Track(Track *track)

{
  bool bVar1;
  int iVar2;
  vector<Sector,_std::allocator<Sector>_> *this;
  reference this_00;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Sector,_std::allocator<Sector>_> *__range1;
  int idx;
  Track *track_local;
  
  iVar2 = Track::size(track);
  if ((iVar2 != 0x14) && (iVar2 = Track::size(track), iVar2 != 0x13)) {
    return false;
  }
  __range1._4_4_ = 0;
  this = Track::sectors(track);
  __end1 = std::vector<Sector,_std::allocator<Sector>_>::begin(this);
  s = (Sector *)std::vector<Sector,_std::allocator<Sector>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                *)&s);
    if (!bVar1) {
      if (opt.debug != 0) {
        util::operator<<((LogHelper *)&util::cout,(char (*) [23])"detected KBI-19 track\n");
      }
      return true;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
              operator*(&__end1);
    if ((((this_00->datarate != _250K) || (this_00->encoding != MFM)) ||
        ((this_00->header).sector != (uint)""[__range1._4_4_])) ||
       ((iVar2 = Sector::size(this_00), iVar2 != 0x200 ||
        ((bVar1 = Sector::has_good_data(this_00), !bVar1 && ((this_00->header).sector != 0x13))))))
    break;
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  return false;
}

Assistant:

bool IsKBI19Track(const Track& track)
{
    static const uint8_t ids[]{ 0,1,4,7,10,13,16,2,5,8,11,14,17,3,6,9,12,15,18,19 };

    // CPC version has 19 sectors, PC version has 20 (with bad sector 19).
    if (track.size() != arraysize(ids) && track.size() != arraysize(ids) - 1)
        return false;

    int idx = 0;
    for (auto& s : track.sectors())
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.sector != ids[idx++] || s.size() != 512 ||
            (!s.has_good_data() && s.header.sector != 19))
            return false;
    }

    if (opt.debug) util::cout << "detected KBI-19 track\n";
    return true;
}